

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

unique_ptr<Catch::TablePrinter> __thiscall
Catch::Detail::
make_unique<Catch::TablePrinter,std::ostream&,std::vector<Catch::ColumnInfo,std::allocator<Catch::ColumnInfo>>>
          (Detail *this,basic_ostream<char,_std::char_traits<char>_> *args,
          vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_> *args_1)

{
  TablePrinter *this_00;
  vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_> local_38;
  
  this_00 = (TablePrinter *)operator_new(0x38);
  local_38.super__Vector_base<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args_1->super__Vector_base<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_38.super__Vector_base<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args_1->super__Vector_base<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args_1->super__Vector_base<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (args_1->super__Vector_base<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->super__Vector_base<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (args_1->super__Vector_base<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TablePrinter::TablePrinter(this_00,args,&local_38);
  *(TablePrinter **)this = this_00;
  std::vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>::~vector(&local_38);
  return (unique_ptr<Catch::TablePrinter>)(TablePrinter *)this;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }